

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# flatc.cpp
# Opt level: O1

string * __thiscall
flatbuffers::FlatCompiler::GetShortUsageString
          (string *__return_storage_ptr__,FlatCompiler *this,string *program_name)

{
  ostream *poVar1;
  _Rb_tree_node_base *p_Var2;
  size_t in_RCX;
  long lVar3;
  string help;
  stringstream ss;
  stringstream ss_textwrap;
  string local_360;
  stringstream local_340 [16];
  ostream local_330 [112];
  ios_base local_2c0 [264];
  stringstream local_1b8 [128];
  ios_base local_138 [264];
  
  std::__cxx11::stringstream::stringstream(local_340);
  std::__ostream_insert<char,std::char_traits<char>>(local_330,"Usage: ",7);
  poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                     (local_330,(program_name->_M_dataplus)._M_p,program_name->_M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1," [",2);
  if (language_options._24_8_ != 0x3f8fe8) {
    p_Var2 = (_Rb_tree_node_base *)language_options._24_8_;
    do {
      AppendShortOption((stringstream *)local_340,(FlatCOption *)(p_Var2 + 1));
      std::__ostream_insert<char,std::char_traits<char>>(local_330,", ",2);
      p_Var2 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var2);
    } while (p_Var2 != (_Rb_tree_node_base *)(language_options + 8));
  }
  lVar3 = 0;
  do {
    AppendShortOption((stringstream *)local_340,(FlatCOption *)((long)&flatc_options + lVar3));
    std::__ostream_insert<char,std::char_traits<char>>(local_330,", ",2);
    lVar3 = lVar3 + 0x80;
  } while (lVar3 != 0x2d00);
  std::ostream::seekp((long)local_330,~_S_cur);
  std::__ostream_insert<char,std::char_traits<char>>
            (local_330,"]... FILE... [-- BINARY_FILE...]",0x20);
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringstream::stringstream(local_1b8);
  AppendTextWrappedString((stringstream *)local_1b8,&local_360,0,in_RCX);
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringstream::~stringstream(local_1b8);
  std::ios_base::~ios_base(local_138);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_360._M_dataplus._M_p != &local_360.field_2) {
    operator_delete(local_360._M_dataplus._M_p,local_360.field_2._M_allocated_capacity + 1);
  }
  std::__cxx11::stringstream::~stringstream(local_340);
  std::ios_base::~ios_base(local_2c0);
  return __return_storage_ptr__;
}

Assistant:

std::string FlatCompiler::GetShortUsageString(
    const std::string &program_name) const {
  std::stringstream ss;
  ss << "Usage: " << program_name << " [";

  for (const FlatCOption &option : language_options) {
    AppendShortOption(ss, option);
    ss << ", ";
  }

  for (const FlatCOption &option : flatc_options) {
    AppendShortOption(ss, option);
    ss << ", ";
  }

  ss.seekp(-2, ss.cur);
  ss << "]... FILE... [-- BINARY_FILE...]";
  std::string help = ss.str();
  std::stringstream ss_textwrap;
  AppendTextWrappedString(ss_textwrap, help, 80, 0);
  return ss_textwrap.str();
}